

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlTextReaderGetParserProp(void)

{
  int iVar1;
  int iVar2;
  int val;
  xmlTextReaderPtr val_00;
  int local_2c;
  int n_prop;
  int prop;
  int n_reader;
  xmlTextReaderPtr reader;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (n_prop = 0; n_prop < 4; n_prop = n_prop + 1) {
    for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
      iVar1 = xmlMemBlocks();
      val_00 = gen_xmlTextReaderPtr(n_prop,0);
      iVar2 = gen_int(local_2c,1);
      val = xmlTextReaderGetParserProp(val_00,iVar2);
      desret_int(val);
      call_tests = call_tests + 1;
      des_xmlTextReaderPtr(n_prop,val_00,0);
      des_int(local_2c,iVar2,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlTextReaderGetParserProp",(ulong)(uint)(iVar2 - iVar1))
        ;
        ret_val = ret_val + 1;
        printf(" %d",(ulong)(uint)n_prop);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlTextReaderGetParserProp(void) {
    int test_ret = 0;

#if defined(LIBXML_READER_ENABLED)
    int mem_base;
    int ret_val;
    xmlTextReaderPtr reader; /* the xmlTextReaderPtr used */
    int n_reader;
    int prop; /* the xmlParserProperties to get */
    int n_prop;

    for (n_reader = 0;n_reader < gen_nb_xmlTextReaderPtr;n_reader++) {
    for (n_prop = 0;n_prop < gen_nb_int;n_prop++) {
        mem_base = xmlMemBlocks();
        reader = gen_xmlTextReaderPtr(n_reader, 0);
        prop = gen_int(n_prop, 1);

        ret_val = xmlTextReaderGetParserProp(reader, prop);
        desret_int(ret_val);
        call_tests++;
        des_xmlTextReaderPtr(n_reader, reader, 0);
        des_int(n_prop, prop, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlTextReaderGetParserProp",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_reader);
            printf(" %d", n_prop);
            printf("\n");
        }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}